

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::RsProdItemSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,RsProdItemSyntax *this,size_t index)

{
  Token token;
  size_t index_local;
  RsProdItemSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->name).kind;
    token._2_1_ = (this->name).field_0x2;
    token.numFlags.raw = (this->name).numFlags.raw;
    token.rawLen = (this->name).rawLen;
    token.info = (this->name).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->argList->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax RsProdItemSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return name;
        case 1: return argList;
        default: return nullptr;
    }
}